

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedGroup::~TestParsingMergeLite_RepeatedGroup
          (TestParsingMergeLite_RepeatedGroup *this)

{
  ~TestParsingMergeLite_RepeatedGroup(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestParsingMergeLite_RepeatedGroup::~TestParsingMergeLite_RepeatedGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMergeLite.RepeatedGroup)
  SharedDtor(*this);
}